

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-create-socket-early.c
# Opt level: O0

int run_test_tcp_create_early_bad_bind(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_140 [8];
  sockaddr_in6 sockname;
  int namelen;
  int r;
  uv_os_fd_t fd;
  uv_tcp_t client;
  sockaddr_in addr;
  
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    fprintf(_stderr,"%s\n","IPv6 not supported");
    fflush(_stderr);
    addr.sin_zero[0] = '\x01';
    addr.sin_zero[1] = '\0';
    addr.sin_zero[2] = '\0';
    addr.sin_zero[3] = '\0';
  }
  else {
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)((long)&client.queued_fds + 4));
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
              ,0x91,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
      abort();
    }
    puVar2 = uv_default_loop();
    sockname.sin6_scope_id = uv_tcp_init_ex(puVar2,(uv_tcp_t *)&r,10);
    if (sockname.sin6_scope_id != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
              ,0x94,"r == 0");
      abort();
    }
    sockname.sin6_scope_id = uv_fileno((uv_handle_t *)&r,&namelen);
    if (sockname.sin6_scope_id != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
              ,0x97,"r == 0");
      abort();
    }
    if (namelen == -1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
              ,0x98,"fd != INVALID_FD");
      abort();
    }
    sockname.sin6_addr.__in6_u.__u6_addr32[3] = 0x1c;
    sockname.sin6_scope_id =
         uv_tcp_getsockname((uv_tcp_t *)&r,(sockaddr *)local_140,
                            (int *)(sockname.sin6_addr.__in6_u.__u6_addr32 + 3));
    if (sockname.sin6_scope_id != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
              ,0xa1,"r == 0");
      abort();
    }
    if (local_140._0_2_ != 10) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
              ,0xa2,"sockname.sin6_family == AF_INET6");
      abort();
    }
    sockname.sin6_scope_id =
         uv_tcp_bind((uv_tcp_t *)&r,(sockaddr *)((long)&client.queued_fds + 4),0);
    if (sockname.sin6_scope_id != 0xffffffea) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
              ,0xa8,"r == UV_EINVAL");
      abort();
    }
    uv_close((uv_handle_t *)&r,(uv_close_cb)0x0);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    close_loop(puVar2);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-create-socket-early.c"
              ,0xb0,"0 == uv_loop_close(uv_default_loop())");
      abort();
    }
    addr.sin_zero[0] = '\0';
    addr.sin_zero[1] = '\0';
    addr.sin_zero[2] = '\0';
    addr.sin_zero[3] = '\0';
  }
  iVar1._0_1_ = addr.sin_zero[0];
  iVar1._1_1_ = addr.sin_zero[1];
  iVar1._2_1_ = addr.sin_zero[2];
  iVar1._3_1_ = addr.sin_zero[3];
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_create_early_bad_bind) {
  struct sockaddr_in addr;
  uv_tcp_t client;
  uv_os_fd_t fd;
  int r;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init_ex(uv_default_loop(), &client, AF_INET6);
  ASSERT(r == 0);

  r = uv_fileno((const uv_handle_t*) &client, &fd);
  ASSERT(r == 0);
  ASSERT(fd != INVALID_FD);

  /* Windows returns WSAEINVAL if the socket is not bound */
#ifndef _WIN32
  {
    int namelen;
    struct sockaddr_in6 sockname;
    namelen = sizeof sockname;
    r = uv_tcp_getsockname(&client, (struct sockaddr*) &sockname, &namelen);
    ASSERT(r == 0);
    ASSERT(sockname.sin6_family == AF_INET6);
  }
#endif

  r = uv_tcp_bind(&client, (const struct sockaddr*) &addr, 0);
#if !defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MSYS__)
  ASSERT(r == UV_EINVAL);
#else
  ASSERT(r == UV_EFAULT);
#endif

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}